

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncSocket.h
# Opt level: O3

pair<int,_bool> __thiscall
uWS::AsyncSocket<true>::uncork(AsyncSocket<true> *this,char *src,int length,bool optionally)

{
  LoopData *pLVar1;
  ulong uVar2;
  ulong uVar3;
  
  pLVar1 = getLoopData(this);
  if ((AsyncSocket<true> *)pLVar1->corkedSocket == this) {
    pLVar1->corkedSocket = (void *)0x0;
    if (pLVar1->corkOffset != 0) {
      uVar3 = 0;
      uVar2 = write(this,(int)pLVar1->corkBuffer,(void *)(ulong)(uint)pLVar1->corkOffset,0);
      pLVar1->corkOffset = 0;
      if ((uVar2 >> 0x20 & 1) != 0) {
        uVar2 = 0x100000000;
        goto LAB_0013aa19;
      }
    }
    uVar3 = write(this,(int)src,(void *)(ulong)(uint)length,(ulong)optionally);
    uVar2 = uVar3 & 0xff00000000;
    uVar3 = uVar3 & 0xffffffff;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
  }
LAB_0013aa19:
  return (pair<int,_bool>)(uVar3 | uVar2);
}

Assistant:

std::pair<int, bool> uncork(const char *src = nullptr, int length = 0, bool optionally = false) {
        LoopData *loopData = getLoopData();

        if (loopData->corkedSocket == this) {
            loopData->corkedSocket = nullptr;

            if (loopData->corkOffset) {
                /* Corked data is already accounted for via its write call */
                auto [written, failed] = write(loopData->corkBuffer, loopData->corkOffset, false, length);
                loopData->corkOffset = 0;

                if (failed) {
                    /* We do not need to care for buffering here, write does that */
                    return {0, true};
                }
            }

            /* We should only return with new writes, not things written to cork already */
            return write(src, length, optionally, 0);
        } else {
            /* We are not even corked! */
            return {0, false};
        }
    }